

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Action<test_result_(int)> * __thiscall
testing::internal::OnCallSpec<test_result_(int)>::GetAction(OnCallSpec<test_result_(int)> *this)

{
  Clause CVar1;
  allocator local_39;
  string local_38;
  
  CVar1 = (this->super_UntypedOnCallSpecBase).last_clause_;
  std::__cxx11::string::string
            ((string *)&local_38,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_39);
  UntypedOnCallSpecBase::AssertSpecProperty
            (&this->super_UntypedOnCallSpecBase,CVar1 == kWillByDefault,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return &this->action_;
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }